

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void __thiscall skiwi::anon_unknown_23::long_apply_2_test::test(long_apply_2_test *this)

{
  allocator<char> local_379;
  string local_378;
  string local_358;
  allocator<char> local_331;
  string local_330;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  string local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  string local_280;
  allocator<char> local_259;
  string local_258;
  string local_238;
  allocator<char> local_211;
  string local_210;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  string local_160;
  allocator<char> local_139;
  string local_138;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  string local_88;
  allocator<char> local_51;
  string local_50;
  string local_30;
  long_apply_2_test *local_10;
  long_apply_2_test *this_local;
  
  local_10 = this;
  compile_fixture_skiwi::build_srfi1((compile_fixture_skiwi *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             "(%apply + (list 1 2 3 4 5 6 7 8 9 10 11 12 13 14 15 16 17 18 19 20))",&local_51);
  compile_fixture_skiwi::run(&local_30,(compile_fixture_skiwi *)this,&local_50);
  TestEq<char_const*,std::__cxx11::string>
            ("210",&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd5a,"void skiwi::(anonymous namespace)::long_apply_2_test::test()");
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,
             "(apply + (list 1 2 3 4 5 6 7 8 9 10 11 12 13 14 15 16 17 18 19 20))",&local_a9);
  compile_fixture_skiwi::run(&local_88,(compile_fixture_skiwi *)this,&local_a8);
  TestEq<char_const*,std::__cxx11::string>
            ("210",&local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd5b,"void skiwi::(anonymous namespace)::long_apply_2_test::test()");
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,
             "(define (rms nums) (sqrt (/ (apply + (map * nums nums))(length nums))))",&local_f1);
  compile_fixture_skiwi::run(&local_d0,(compile_fixture_skiwi *)this,&local_f0);
  TestEq<char_const*,std::__cxx11::string>
            ("<lambda>",&local_d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd5c,"void skiwi::(anonymous namespace)::long_apply_2_test::test()");
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"(rms (list 1 2 3 4 5 6 7 8 9 10 11 12 13 14 15 16 17 18 19 20))",
             &local_139);
  compile_fixture_skiwi::run(&local_118,(compile_fixture_skiwi *)this,&local_138);
  TestEq<char_const*,std::__cxx11::string>
            ("11.9791",&local_118,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd5d,"void skiwi::(anonymous namespace)::long_apply_2_test::test()");
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,
             "(define dm (list 1 2 3 4 5 6 7 8 9 10 11 12 13 14 15 16 17 18 19 20))",&local_181);
  compile_fixture_skiwi::run(&local_160,(compile_fixture_skiwi *)this,&local_180);
  TestEq<char_const*,std::__cxx11::string>
            ("(1 2 3 4 5 6 7 8 9 10 11 12 13 14 15 16 17 18 19 20)",&local_160,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd5e,"void skiwi::(anonymous namespace)::long_apply_2_test::test()");
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"dm",&local_1c9);
  compile_fixture_skiwi::run(&local_1a8,(compile_fixture_skiwi *)this,&local_1c8);
  TestEq<char_const*,std::__cxx11::string>
            ("(1 2 3 4 5 6 7 8 9 10 11 12 13 14 15 16 17 18 19 20)",&local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd5f,"void skiwi::(anonymous namespace)::long_apply_2_test::test()");
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"(rms dm)",&local_211);
  compile_fixture_skiwi::run(&local_1f0,(compile_fixture_skiwi *)this,&local_210);
  TestEq<char_const*,std::__cxx11::string>
            ("11.9791",&local_1f0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd60,"void skiwi::(anonymous namespace)::long_apply_2_test::test()");
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"dm",&local_259);
  compile_fixture_skiwi::run(&local_238,(compile_fixture_skiwi *)this,&local_258);
  TestEq<char_const*,std::__cxx11::string>
            ("(1 2 3 4 5 6 7 8 9 10 11 12 13 14 15 16 17 18 19 20)",&local_238,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd61,"void skiwi::(anonymous namespace)::long_apply_2_test::test()");
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"(iota 5)",&local_2a1);
  compile_fixture_skiwi::run(&local_280,(compile_fixture_skiwi *)this,&local_2a0);
  TestEq<char_const*,std::__cxx11::string>
            ("(0 1 2 3 4)",&local_280,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd62,"void skiwi::(anonymous namespace)::long_apply_2_test::test()");
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,"(define dm (iota 2000)) (length dm)",&local_2e9);
  compile_fixture_skiwi::run(&local_2c8,(compile_fixture_skiwi *)this,&local_2e8);
  TestEq<char_const*,std::__cxx11::string>
            ("2000",&local_2c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd63,"void skiwi::(anonymous namespace)::long_apply_2_test::test()");
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"(apply + dm)",&local_331)
  ;
  compile_fixture_skiwi::run(&local_310,(compile_fixture_skiwi *)this,&local_330);
  TestEq<char_const*,std::__cxx11::string>
            ("1999000",&local_310,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd64,"void skiwi::(anonymous namespace)::long_apply_2_test::test()");
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator(&local_331);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_378,"(length dm)",&local_379);
  compile_fixture_skiwi::run(&local_358,(compile_fixture_skiwi *)this,&local_378);
  TestEq<char_const*,std::__cxx11::string>
            ("2000",&local_358,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xd65,"void skiwi::(anonymous namespace)::long_apply_2_test::test()");
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator(&local_379);
  return;
}

Assistant:

void test()
      {
      build_srfi1();
      TEST_EQ("210", run("(%apply + (list 1 2 3 4 5 6 7 8 9 10 11 12 13 14 15 16 17 18 19 20))"));
      TEST_EQ("210", run("(apply + (list 1 2 3 4 5 6 7 8 9 10 11 12 13 14 15 16 17 18 19 20))"));
      TEST_EQ("<lambda>", run("(define (rms nums) (sqrt (/ (apply + (map * nums nums))(length nums))))"));
      TEST_EQ("11.9791", run("(rms (list 1 2 3 4 5 6 7 8 9 10 11 12 13 14 15 16 17 18 19 20))"));
      TEST_EQ("(1 2 3 4 5 6 7 8 9 10 11 12 13 14 15 16 17 18 19 20)", run("(define dm (list 1 2 3 4 5 6 7 8 9 10 11 12 13 14 15 16 17 18 19 20))"));
      TEST_EQ("(1 2 3 4 5 6 7 8 9 10 11 12 13 14 15 16 17 18 19 20)", run("dm"));
      TEST_EQ("11.9791", run("(rms dm)"));
      TEST_EQ("(1 2 3 4 5 6 7 8 9 10 11 12 13 14 15 16 17 18 19 20)", run("dm"));
      TEST_EQ("(0 1 2 3 4)", run("(iota 5)"));
      TEST_EQ("2000", run("(define dm (iota 2000)) (length dm)"));
      TEST_EQ("1999000", run("(apply + dm)"));
      TEST_EQ("2000", run("(length dm)"));
      }